

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O2

char * __thiscall
Potassco::ProgramOptions::anon_unknown_15::CommandStringParser::next(CommandStringParser *this)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  byte *pbVar7;
  
  pbVar7 = (byte *)this->cmd_;
  while( true ) {
    bVar1 = *pbVar7;
    iVar2 = isspace((uint)bVar1);
    if (iVar2 == 0) break;
    this->cmd_ = (char *)(pbVar7 + 1);
    pbVar7 = pbVar7 + 1;
  }
  if (bVar1 == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    (this->tok_)._M_string_length = 0;
    *(this->tok_)._M_dataplus._M_p = '\0';
    pcVar3 = this->cmd_;
    cVar5 = ' ';
    while (cVar6 = *pcVar3, cVar6 != '\0') {
      if (cVar6 == cVar5) {
        cVar6 = ' ';
        if (cVar5 == ' ') break;
      }
      else if (cVar6 != '\"' && cVar6 != '\'' || cVar5 != ' ') {
        cVar4 = (char)&this->tok_;
        if (((cVar6 == '\\') && ((byte)pcVar3[1] - 0x22 < 0x3b)) &&
           ((0x400000000000021U >> ((ulong)((byte)pcVar3[1] - 0x22) & 0x3f) & 1) != 0)) {
          std::__cxx11::string::push_back(cVar4);
          this->cmd_ = this->cmd_ + 1;
          cVar6 = cVar5;
        }
        else {
          std::__cxx11::string::push_back(cVar4);
          cVar6 = cVar5;
        }
      }
      pcVar3 = this->cmd_ + 1;
      this->cmd_ = pcVar3;
      cVar5 = cVar6;
    }
    pcVar3 = (this->tok_)._M_dataplus._M_p;
  }
  return pcVar3;
}

Assistant:

const char* next() {
		// skip leading white
		while (std::isspace(static_cast<unsigned char>(*cmd_))) { ++cmd_; }
		if (!*cmd_) return 0;
		tok_.clear();
		// find end of current arg
		for (char c, t = ' ', n; (c = *cmd_) != 0; ++cmd_) {
			if (c == t) { if (t == ' ') break; t = ' '; }
			else if ((c == '\'' || c == '"') && t == ' ') { t = c; }
			else if (c != '\\') { tok_ += c; }
			else if ((n = cmd_[1]) == '"' || n == '\'' || n == '\\') { tok_ += n; ++cmd_; }
			else { tok_ += c; }
		}
		return tok_.c_str();
	}